

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenterCmd.cpp
# Opt level: O0

void custom_getopt_initialize(custom_getopt_data *d)

{
  custom_getopt_data *d_local;
  
  d->last_nonopt = d->custom_optind;
  d->first_nonopt = d->custom_optind;
  d->nextchar = (char *)0x0;
  d->initialized = 1;
  return;
}

Assistant:

static void custom_getopt_initialize(struct custom_getopt_data *d)
{
	/*
	 * Start processing options with ARGV-element 1 (since ARGV-element 0
	 * is the program name); the sequence of previously skipped non-option
	 * ARGV-elements is empty.
	 */
	d->first_nonopt = d->last_nonopt = d->custom_optind;
	d->nextchar = NULL;
	d->initialized = 1;
}